

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O2

vector<crnlib::color_quad<unsigned_char,_int>_> * __thiscall
crnlib::vector<crnlib::color_quad<unsigned_char,_int>_>::append
          (vector<crnlib::color_quad<unsigned_char,_int>_> *this,
          vector<crnlib::color_quad<unsigned_char,_int>_> *other)

{
  if (other->m_size != 0) {
    insert(this,this->m_size,other->m_p,other->m_size);
  }
  return this;
}

Assistant:

vector& append(const vector& other)
        {
            if (other.m_size)
            {
                insert(m_size, &other[0], other.m_size);
            }
            return *this;
        }